

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# global_mgr.cxx
# Opt level: O2

void __thiscall
nuraft::nuraft_global_mgr::request_append(nuraft_global_mgr *this,ptr<raft_server> *server)

{
  mutex *__mutex;
  element_type *peVar1;
  element_type *peVar2;
  int iVar3;
  iterator iVar4;
  pointer psVar5;
  string local_40;
  
  __mutex = &this->append_queue_lock_;
  std::mutex::lock(__mutex);
  iVar4 = std::
          _Hashtable<std::shared_ptr<nuraft::raft_server>,_std::shared_ptr<nuraft::raft_server>,_std::allocator<std::shared_ptr<nuraft::raft_server>_>,_std::__detail::_Identity,_std::equal_to<std::shared_ptr<nuraft::raft_server>_>,_std::hash<std::shared_ptr<nuraft::raft_server>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
          ::find(&(this->append_server_set_)._M_h,server);
  if (iVar4.super__Node_iterator_base<std::shared_ptr<nuraft::raft_server>,_false>._M_cur !=
      (__node_type *)0x0) {
    pthread_mutex_unlock((pthread_mutex_t *)__mutex);
    return;
  }
  std::__cxx11::
  list<std::shared_ptr<nuraft::raft_server>,_std::allocator<std::shared_ptr<nuraft::raft_server>_>_>
  ::push_back(&this->append_queue_,server);
  std::__detail::
  _Insert_base<std::shared_ptr<nuraft::raft_server>,_std::shared_ptr<nuraft::raft_server>,_std::allocator<std::shared_ptr<nuraft::raft_server>_>,_std::__detail::_Identity,_std::equal_to<std::shared_ptr<nuraft::raft_server>_>,_std::hash<std::shared_ptr<nuraft::raft_server>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  ::insert((_Insert_base<std::shared_ptr<nuraft::raft_server>,_std::shared_ptr<nuraft::raft_server>,_std::allocator<std::shared_ptr<nuraft::raft_server>_>,_std::__detail::_Identity,_std::equal_to<std::shared_ptr<nuraft::raft_server>_>,_std::hash<std::shared_ptr<nuraft::raft_server>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
            *)&this->append_server_set_,server);
  peVar1 = (server->super___shared_ptr<nuraft::raft_server,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  peVar2 = (peVar1->l_).super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  if ((peVar2 != (element_type *)0x0) &&
     (iVar3 = (**(code **)(*(long *)peVar2 + 0x38))(), 5 < iVar3)) {
    peVar2 = (peVar1->l_).super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    msg_if_given_abi_cxx11_
              (&local_40,"added append request to global queue, server %p, queue length %zu",
               (server->super___shared_ptr<nuraft::raft_server,_(__gnu_cxx::_Lock_policy)2>)._M_ptr,
               (this->append_queue_).
               super__List_base<std::shared_ptr<nuraft::raft_server>,_std::allocator<std::shared_ptr<nuraft::raft_server>_>_>
               ._M_impl._M_node._M_size);
    (**(code **)(*(long *)peVar2 + 0x40))
              (peVar2,6,
               "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/global_mgr.cxx"
               ,"request_append",0xdf,&local_40);
    std::__cxx11::string::~string((string *)&local_40);
  }
  pthread_mutex_unlock((pthread_mutex_t *)__mutex);
  psVar5 = (this->append_workers_).
           super__Vector_base<std::shared_ptr<nuraft::nuraft_global_mgr::worker_handle>,_std::allocator<std::shared_ptr<nuraft::nuraft_global_mgr::worker_handle>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  while( true ) {
    if (psVar5 == (this->append_workers_).
                  super__Vector_base<std::shared_ptr<nuraft::nuraft_global_mgr::worker_handle>,_std::allocator<std::shared_ptr<nuraft::nuraft_global_mgr::worker_handle>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish) {
      return;
    }
    if ((((psVar5->
          super___shared_ptr<nuraft::nuraft_global_mgr::worker_handle,_(__gnu_cxx::_Lock_policy)2>).
         _M_ptr)->status_)._M_i == SLEEPING) break;
    psVar5 = psVar5 + 1;
  }
  EventAwaiter::invoke
            (&((psVar5->
               super___shared_ptr<nuraft::nuraft_global_mgr::worker_handle,_(__gnu_cxx::_Lock_policy)2>
               )._M_ptr)->ea_);
  return;
}

Assistant:

void nuraft_global_mgr::request_append(ptr<raft_server> server) {
    {
        std::lock_guard<std::mutex> l(append_queue_lock_);
        // First search the set if the server is duplicate.
        auto entry = append_server_set_.find(server);
        if (entry != append_server_set_.end()) {
            // `server` is already in the queue. Ignore it.
            return;
        }

        // Put into queue.
        append_queue_.push_back(server);
        append_server_set_.insert(server);

        ptr<logger>& l_ = server->l_;
        p_tr("added append request to global queue, "
             "server %p, queue length %zu",
             server.get(),
             append_queue_.size());
    }

    // Find a sleeping worker and invoke.
    for (auto& entry: append_workers_) {
        ptr<worker_handle>& wh = entry;
        if (wh->status_ == worker_handle::SLEEPING) {
            wh->ea_.invoke();
            break;
        }
    }
    // If all workers are working, nothing to do for now.
}